

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

cmStateSnapshot * __thiscall
cmStateSnapshot::GetCallStackBottom(cmStateSnapshot *__return_storage_ptr__,cmStateSnapshot *this)

{
  PositionType position;
  bool bVar1;
  PointerType pSVar2;
  iterator other;
  bool local_71;
  undefined1 local_30 [8];
  PositionType pos;
  cmStateSnapshot *this_local;
  
  if (this->State == (cmState *)0x0) {
    __assert_fail("this->State",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmStateSnapshot.cxx"
                  ,0x74,"cmStateSnapshot cmStateSnapshot::GetCallStackBottom() const");
  }
  join_0x00000010_0x00000000_ =
       cmLinkedTree<cmStateDetail::SnapshotDataType>::Root(&this->State->SnapshotData);
  bVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator!=
                    (&this->Position,join_0x00000010_0x00000000_);
  if (!bVar1) {
    __assert_fail("this->Position != this->State->SnapshotData.Root()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmStateSnapshot.cxx"
                  ,0x75,"cmStateSnapshot cmStateSnapshot::GetCallStackBottom() const");
  }
  local_30 = (undefined1  [8])(this->Position).Tree;
  pos.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(this->Position).Position;
  while( true ) {
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                       ((iterator *)local_30);
    local_71 = false;
    if (pSVar2->SnapshotType != BaseType) {
      pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         ((iterator *)local_30);
      local_71 = false;
      if (pSVar2->SnapshotType != BuildsystemDirectoryType) {
        other = cmLinkedTree<cmStateDetail::SnapshotDataType>::Root(&this->State->SnapshotData);
        local_71 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator!=
                             ((iterator *)local_30,other);
      }
    }
    if (local_71 == false) break;
    cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator++((iterator *)local_30);
  }
  position.Position = (PositionType)pos.Tree;
  position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_30;
  cmStateSnapshot(__return_storage_ptr__,this->State,position);
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmStateSnapshot::GetCallStackBottom() const
{
  assert(this->State);
  assert(this->Position != this->State->SnapshotData.Root());

  cmStateDetail::PositionType pos = this->Position;
  while (pos->SnapshotType != cmStateEnums::BaseType &&
         pos->SnapshotType != cmStateEnums::BuildsystemDirectoryType &&
         pos != this->State->SnapshotData.Root()) {
    ++pos;
  }
  return cmStateSnapshot(this->State, pos);
}